

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

size_t __thiscall Imf_3_4::DeepTiledInputFile::totalTiles(DeepTiledInputFile *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  ArgExc *this_00;
  int i_l;
  int iVar5;
  int iVar6;
  int i_lx;
  
  peVar4 = (this->_data).
           super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4->tile_level_mode < EXR_TILE_RIPMAP_LEVELS) {
    iVar5 = 0;
    iVar6 = 0;
    while( true ) {
      iVar1 = numLevels(this);
      if (iVar1 <= iVar5) break;
      iVar1 = numXTiles(this,iVar5);
      iVar2 = numYTiles(this,iVar5);
      iVar6 = iVar6 + iVar2 * iVar1;
      iVar5 = iVar5 + 1;
    }
  }
  else {
    if (peVar4->tile_level_mode != EXR_TILE_RIPMAP_LEVELS) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,"Unknown LevelMode format.");
      __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    iVar6 = 0;
    for (iVar5 = 0; iVar5 < peVar4->num_y_levels; iVar5 = iVar5 + 1) {
      for (iVar1 = 0; iVar1 < peVar4->num_x_levels; iVar1 = iVar1 + 1) {
        iVar2 = numXTiles(this,iVar1);
        iVar3 = numYTiles(this,iVar5);
        iVar6 = iVar6 + iVar3 * iVar2;
        peVar4 = (this->_data).
                 super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      }
    }
  }
  return (long)iVar6;
}

Assistant:

size_t
DeepTiledInputFile::totalTiles () const
{
    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:

            for (int i_l = 0; i_l < numLevels (); ++i_l)
                numAllTiles += numXTiles (i_l) * numYTiles (i_l);

            break;

        case RIPMAP_LEVELS:

            for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
                for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                    numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }
    return numAllTiles;
}